

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

Transform * __thiscall pbrt::TransformCache::Lookup(TransformCache *this,Transform *t)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  __node_base_ptr p_Var4;
  Transform *pTVar5;
  memory_resource *pmVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined4 extraout_var;
  ulong uVar23;
  long lVar24;
  Transform *pTVar25;
  __hashtable *__h;
  ulong uVar26;
  _Hash_node_base *p_Var27;
  Transform *pTVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  Transform *tptr;
  __node_gen_type __node_gen;
  Transform *local_20;
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  *local_18;
  
  *(long *)(in_FS_OFFSET + -0x1d8) = *(long *)(in_FS_OFFSET + -0x1d8) + 1;
  if ((this->hashTable)._M_h._M_element_count != 0) {
    uVar23 = 0xa929e4d6f47a6540;
    lVar24 = 0;
    do {
      plVar1 = (long *)((long)(t->m).m[0] + lVar24);
      lVar24 = lVar24 + 8;
      uVar26 = *plVar1 * -0x395b586ca42e166b;
      uVar23 = (uVar23 ^ (uVar26 >> 0x2f ^ uVar26) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
    } while (lVar24 != 0x40);
    uVar26 = (this->hashTable)._M_h._M_bucket_count;
    uVar23 = (uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b;
    uVar23 = (uVar23 >> 0x2f ^ uVar23) % uVar26;
    p_Var4 = (this->hashTable)._M_h._M_buckets[uVar23];
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var27 = p_Var4->_M_nxt, p_Var27 != (_Hash_node_base *)0x0)) {
LAB_003a6374:
      pTVar5 = (Transform *)p_Var27[1]._M_nxt;
      uVar29 = 0;
      bVar30 = false;
      pTVar25 = t;
      pTVar28 = pTVar5;
      do {
        lVar24 = 0;
        do {
          fVar2 = (pTVar25->m).m[0][lVar24];
          fVar3 = (pTVar28->m).m[0][lVar24];
          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
            if (bVar30) goto LAB_003a6443;
            p_Var27 = p_Var27->_M_nxt;
            if ((p_Var27 == (_Hash_node_base *)0x0) || ((ulong)p_Var27[2]._M_nxt % uVar26 != uVar23)
               ) goto LAB_003a63de;
            goto LAB_003a6374;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        bVar30 = 2 < uVar29;
        uVar29 = uVar29 + 1;
        pTVar28 = (Transform *)((pTVar28->m).m + 1);
        pTVar25 = (Transform *)((pTVar25->m).m + 1);
        if (uVar29 == 4) {
LAB_003a6443:
          *(long *)(in_FS_OFFSET + -0x1d0) = *(long *)(in_FS_OFFSET + -0x1d0) + 1;
          return pTVar5;
        }
      } while( true );
    }
  }
LAB_003a63de:
  pmVar6 = (this->alloc).memoryResource;
  iVar22 = (*pmVar6->_vptr_memory_resource[2])(pmVar6,0x80,4);
  local_20 = (Transform *)CONCAT44(extraout_var,iVar22);
  uVar7 = *(undefined8 *)(t->m).m[0];
  uVar8 = *(undefined8 *)((t->m).m[0] + 2);
  uVar9 = *(undefined8 *)(t->m).m[1];
  uVar10 = *(undefined8 *)((t->m).m[1] + 2);
  uVar11 = *(undefined8 *)(t->m).m[2];
  uVar12 = *(undefined8 *)((t->m).m[2] + 2);
  uVar13 = *(undefined8 *)(t->m).m[3];
  uVar14 = *(undefined8 *)((t->m).m[3] + 2);
  uVar15 = *(undefined8 *)((t->mInv).m[0] + 2);
  uVar16 = *(undefined8 *)(t->mInv).m[1];
  uVar17 = *(undefined8 *)((t->mInv).m[1] + 2);
  uVar18 = *(undefined8 *)(t->mInv).m[2];
  uVar19 = *(undefined8 *)((t->mInv).m[2] + 2);
  uVar20 = *(undefined8 *)(t->mInv).m[3];
  uVar21 = *(undefined8 *)((t->mInv).m[3] + 2);
  *(undefined8 *)(local_20->mInv).m[0] = *(undefined8 *)(t->mInv).m[0];
  *(undefined8 *)((local_20->mInv).m[0] + 2) = uVar15;
  *(undefined8 *)(local_20->mInv).m[1] = uVar16;
  *(undefined8 *)((local_20->mInv).m[1] + 2) = uVar17;
  *(undefined8 *)(local_20->mInv).m[2] = uVar18;
  *(undefined8 *)((local_20->mInv).m[2] + 2) = uVar19;
  *(undefined8 *)(local_20->mInv).m[3] = uVar20;
  *(undefined8 *)((local_20->mInv).m[3] + 2) = uVar21;
  *(undefined8 *)(local_20->m).m[0] = uVar7;
  *(undefined8 *)((local_20->m).m[0] + 2) = uVar8;
  *(undefined8 *)(local_20->m).m[1] = uVar9;
  *(undefined8 *)((local_20->m).m[1] + 2) = uVar10;
  *(undefined8 *)(local_20->m).m[2] = uVar11;
  *(undefined8 *)((local_20->m).m[2] + 2) = uVar12;
  *(undefined8 *)(local_20->m).m[3] = uVar13;
  *(undefined8 *)((local_20->m).m[3] + 2) = uVar14;
  *(long *)(in_FS_OFFSET + -0x1c8) = *(long *)(in_FS_OFFSET + -0x1c8) + 0x80;
  local_18 = &this->hashTable;
  std::
  _Hashtable<pbrt::Transform*,pbrt::Transform*,std::allocator<pbrt::Transform*>,std::__detail::_Identity,std::equal_to<pbrt::Transform*>,pbrt::TransformHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<pbrt::Transform*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pbrt::Transform*,true>>>>
            ((_Hashtable<pbrt::Transform*,pbrt::Transform*,std::allocator<pbrt::Transform*>,std::__detail::_Identity,std::equal_to<pbrt::Transform*>,pbrt::TransformHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->hashTable,&local_20);
  return local_20;
}

Assistant:

const Transform *TransformCache::Lookup(const Transform &t) {
    ++nTransformCacheLookups;

    if (!hashTable.empty()) {
        size_t offset = t.Hash() % hashTable.bucket_count();
        for (auto iter = hashTable.begin(offset); iter != hashTable.end(offset); ++iter) {
            if (**iter == t) {
                ++nTransformCacheHits;
                return *iter;
            }
        }
    }
    Transform *tptr = alloc.new_object<Transform>(t);
    transformCacheBytes += sizeof(Transform);
    hashTable.insert(tptr);
    return tptr;
}